

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O0

CF2_F16Dot16 cf2_stack_getReal(CF2_Stack stack,FT_UFast idx)

{
  CF2_NumberType CVar1;
  FT_UFast FVar2;
  int local_28;
  FT_UFast idx_local;
  CF2_Stack stack_local;
  
  FVar2 = cf2_stack_count(stack);
  if (idx < FVar2) {
    CVar1 = stack->buffer[idx].type;
    if (CVar1 == CF2_NumberFrac) {
      if (stack->buffer[idx].u.r < 0) {
        local_28 = -(0x2000 - stack->buffer[idx].u.r >> 0xe);
      }
      else {
        local_28 = stack->buffer[idx].u.r + 0x2000 >> 0xe;
      }
      stack_local._4_4_ = local_28;
    }
    else if (CVar1 == CF2_NumberInt) {
      stack_local._4_4_ = stack->buffer[idx].u.r << 0x10;
    }
    else {
      stack_local._4_4_ = stack->buffer[idx].u.r;
    }
  }
  else {
    cf2_setError(stack->error,0x82);
    stack_local._4_4_ = 0;
  }
  return stack_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( CF2_Fixed )
  cf2_stack_getReal( CF2_Stack  stack,
                     CF2_UInt   idx )
  {
    FT_ASSERT( cf2_stack_count( stack ) <= stack->stackSize );

    if ( idx >= cf2_stack_count( stack ) )
    {
      CF2_SET_ERROR( stack->error, Stack_Overflow );
      return cf2_intToFixed( 0 );    /* bounds error */
    }

    switch ( stack->buffer[idx].type )
    {
    case CF2_NumberInt:
      return cf2_intToFixed( stack->buffer[idx].u.i );
    case CF2_NumberFrac:
      return cf2_fracToFixed( stack->buffer[idx].u.f );
    default:
      return stack->buffer[idx].u.r;
    }
  }